

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsCpp.cpp
# Opt level: O1

void __thiscall gdscpp::reset(gdscpp *this)

{
  pointer pgVar1;
  pointer pgVar2;
  pointer piVar3;
  pointer this_00;
  
  this->version_number = 7;
  this->generations = 3;
  this->units[0] = 0.001;
  this->units[1] = 1e-09;
  pgVar1 = (this->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
           super__Vector_impl_data._M_start;
  pgVar2 = (this->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
           super__Vector_impl_data._M_finish;
  this_00 = pgVar1;
  if (pgVar2 != pgVar1) {
    do {
      gdsSTR::~gdsSTR(this_00);
      this_00 = this_00 + 1;
    } while (this_00 != pgVar2);
    (this->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.super__Vector_impl_data.
    _M_finish = pgVar1;
  }
  piVar3 = (this->last_modified).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->last_modified).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar3) {
    (this->last_modified).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar3;
  }
  std::__cxx11::string::_M_replace
            ((ulong)&this->library_name,0,(char *)(this->library_name)._M_string_length,0x1174d6);
  return;
}

Assistant:

void gdscpp::reset()
{
  version_number = 7;
  generations = 3;
  units[0] = 0.001;
  units[1] = 1e-9;
  STR.clear();
  last_modified.clear();
  library_name = "Untitled_library";
}